

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQFailure<CLI::MultiOptionPolicy,CLI::MultiOptionPolicy>
          (internal *this,char *lhs_expression,char *rhs_expression,MultiOptionPolicy *lhs,
          MultiOptionPolicy *rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar2;
  string local_60;
  string local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  PrintToString<CLI::MultiOptionPolicy>(&local_40,lhs);
  PrintToString<CLI::MultiOptionPolicy>(&local_60,rhs);
  AVar2 = EqFailure(this,lhs_expression,rhs_expression,(string *)&local_40,(string *)&local_60,false
                   );
  sVar1 = AVar2.message_.ptr_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
    sVar1.ptr_ = extraout_RDX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
    sVar1.ptr_ = extraout_RDX_00;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}